

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int Gia_ManHashLookup(Gia_Man_t *p,Gia_Obj_t *p0,Gia_Obj_t *p1)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  pGVar3 = (Gia_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar3) && (pGVar3 < pGVar1 + p->nObjs)) {
    iVar2 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2);
    if (-1 < iVar2 * -0x55555555) {
      pGVar3 = (Gia_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
      if ((pGVar3 < pGVar1) || (pGVar1 + p->nObjs <= pGVar3)) goto LAB_00208594;
      iVar4 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2);
      if (-1 < iVar4 * -0x55555555) {
        iVar2 = Gia_ManHashLookupInt
                          (p,((uint)p0 & 1) + iVar2 * 0x55555556,((uint)p1 & 1) + iVar4 * 0x55555556
                          );
        return iVar2;
      }
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_00208594:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManHashLookup( Gia_Man_t * p, Gia_Obj_t * p0, Gia_Obj_t * p1 )
{
    int iLit0 = Gia_ObjToLit( p, p0 );
    int iLit1 = Gia_ObjToLit( p, p1 );
    return Gia_ManHashLookupInt( p, iLit0, iLit1 );
}